

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

void opj_tgt_destroy(opj_tgt_tree_t *p_tree)

{
  if (p_tree != (opj_tgt_tree_t *)0x0) {
    if (p_tree->nodes != (opj_tgt_node_t *)0x0) {
      opj_free(p_tree->nodes);
      p_tree->nodes = (opj_tgt_node_t *)0x0;
    }
    opj_free(p_tree);
    return;
  }
  return;
}

Assistant:

void opj_tgt_destroy(opj_tgt_tree_t *p_tree)
{
        if (! p_tree) {
                return;
        }

        if (p_tree->nodes) {
                opj_free(p_tree->nodes);
                p_tree->nodes = 00;
        }
        opj_free(p_tree);
}